

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tdm.cpp
# Opt level: O1

int __thiscall
CGameControllerTDM::OnCharacterDeath
          (CGameControllerTDM *this,CCharacter *pVictim,CPlayer *pKiller,int Weapon)

{
  int *piVar1;
  IServer *pIVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  
  IGameController::OnCharacterDeath(&this->super_IGameController,pVictim,pKiller,Weapon);
  if (Weapon == -3 || pKiller == (CPlayer *)0x0) goto LAB_00122f00;
  if (pVictim->m_pPlayer == pKiller) {
LAB_00122eea:
    uVar3 = pKiller->m_Team;
    iVar4 = -1;
  }
  else {
    uVar3 = pKiller->m_Team;
    iVar4 = 1;
    if (uVar3 == pVictim->m_pPlayer->m_Team) goto LAB_00122eea;
  }
  piVar1 = (this->super_IGameController).m_aTeamscore + (uVar3 & 1);
  *piVar1 = *piVar1 + iVar4;
LAB_00122f00:
  pIVar2 = (this->super_IGameController).m_pServer;
  iVar4 = pVictim->m_pPlayer->m_RespawnTick;
  iVar5 = ((this->super_IGameController).m_pConfig)->m_SvRespawnDelayTDM * pIVar2->m_TickSpeed +
          pIVar2->m_CurrentGameTick;
  if (iVar5 < iVar4) {
    iVar5 = iVar4;
  }
  pVictim->m_pPlayer->m_RespawnTick = iVar5;
  return 0;
}

Assistant:

int CGameControllerTDM::OnCharacterDeath(class CCharacter *pVictim, class CPlayer *pKiller, int Weapon)
{
	IGameController::OnCharacterDeath(pVictim, pKiller, Weapon);


	if(pKiller && Weapon != WEAPON_GAME)
	{
		// do team scoring
		if(pKiller == pVictim->GetPlayer() || pKiller->GetTeam() == pVictim->GetPlayer()->GetTeam())
			m_aTeamscore[pKiller->GetTeam()&1]--; // klant arschel
		else
			m_aTeamscore[pKiller->GetTeam()&1]++; // good shit
	}

	pVictim->GetPlayer()->m_RespawnTick = maximum(pVictim->GetPlayer()->m_RespawnTick, Server()->Tick()+Server()->TickSpeed()*Config()->m_SvRespawnDelayTDM);

	return 0;
}